

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

_Bool monster_change_shape(monster *mon)

{
  loc_conflict grid;
  _Bool _Var1;
  wchar_t wVar2;
  monster_spell *pmVar3;
  player_race *ppVar4;
  int iVar5;
  source sVar6;
  source origin;
  char local_a8 [8];
  char m_name [80];
  monster_spell *spell;
  wchar_t summon_type;
  wchar_t index;
  wchar_t which;
  wchar_t poss;
  wchar_t i;
  bitflag summon_spells [13];
  wchar_t choice;
  monster_race *race;
  monster_shape *shape;
  monster *mon_local;
  
  race = (monster_race *)mon->race->shapes;
  stack0xffffffffffffffe0 = (monster_race *)0x0;
  if (race == (monster_race *)0x0) {
    index = L'\0';
    spell._0_4_ = L'\0';
    create_mon_spell_mask((bitflag *)((long)&poss + 3),0x400,0);
    flag_inter((bitflag *)((long)&poss + 3),mon->race->spell_flags,0xd);
    for (which = flag_next((bitflag *)((long)&poss + 3),0xd,1); which != L'\0';
        which = flag_next((bitflag *)((long)&poss + 3),0xd,which + L'\x01')) {
      index = index + L'\x01';
    }
    if (index != L'\0') {
      wVar2 = Rand_div(index);
      spell._4_4_ = flag_next((bitflag *)((long)&poss + 3),0xd,1);
      for (which = L'\0'; which < wVar2; which = which + L'\x01') {
        spell._4_4_ = flag_next((bitflag *)((long)&poss + 3),0xd,spell._4_4_);
      }
      pmVar3 = monster_spell_by_index(spell._4_4_);
      spell._0_4_ = pmVar3->effect->subtype;
      wVar2 = summon_name_to_idx("KIN");
      if ((wchar_t)spell == wVar2) {
        kin_base = mon->race->base;
      }
    }
    register0x00000000 = select_shape(mon,(wchar_t)spell);
  }
  else {
    summon_spells._5_4_ = Rand_div(mon->race->num_shapes);
    while (iVar5 = summon_spells._5_4_ + -1, summon_spells._5_4_ != 0) {
      race = race->next;
      summon_spells._5_4_ = iVar5;
    }
    if (race->name == (char *)0x0) {
      shape_base = (monster_base *)race->text;
      summon_spells._5_4_ = iVar5;
      get_mon_num_prep(monster_base_shape_okay);
      register0x00000000 = get_mon_num(player->depth + L'\x05',(int)player->depth);
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    }
    else {
      unique0x00012000 = (monster_race *)race->name;
      summon_spells._5_4_ = iVar5;
    }
  }
  _Var1 = monster_is_obvious(mon);
  if (_Var1) {
    monster_desc(local_a8,0x50,mon,L'̔');
    msgt(0,"%s %s",local_a8,"shimmers and changes!");
    if (player->upkeep->health_who == mon) {
      player->upkeep->redraw = player->upkeep->redraw | 0x200;
    }
    player->upkeep->redraw = player->upkeep->redraw | 0x400000;
    square_light_spot((chunk *)cave,mon->grid);
  }
  if (stack0xffffffffffffffe0 != (monster_race *)0x0) {
    if (mon->original_race == (monster_race *)0x0) {
      mon->original_race = mon->race;
      if (mon->original_player_race != (player_race *)0x0) {
        __assert_fail("!mon->original_player_race",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-util.c"
                      ,0x6cb,"_Bool monster_change_shape(struct monster *)");
      }
      mon->original_player_race = mon->player_race;
    }
    mon->race = stack0xffffffffffffffe0;
    _Var1 = flag_has_dbg(stack0xffffffffffffffe0->flags,0xc,0x24,"race->flags","RF_PLAYER");
    if (_Var1) {
      ppVar4 = get_player_race();
      mon->player_race = ppVar4;
    }
    else {
      mon->player_race = (player_race *)0x0;
    }
    mon->mspeed = mon->mspeed + ((char)mon->race->speed - (char)mon->original_race->speed);
  }
  _Var1 = monster_passes_walls(mon);
  if ((!_Var1) &&
     (grid.x = (mon->grid).x, grid.y = (mon->grid).y,
     _Var1 = square_is_monster_walkable((chunk *)cave,grid), !_Var1)) {
    sVar6 = source_monster(mon->midx);
    origin.which = sVar6.which;
    origin._4_4_ = 0;
    origin.what = sVar6.what;
    effect_simple(L';',origin,"1",L'\0',L'\0',L'\0',(mon->grid).y,(mon->grid).x,(_Bool *)0x0);
  }
  return mon->original_race != (monster_race *)0x0;
}

Assistant:

bool monster_change_shape(struct monster *mon)
{
	struct monster_shape *shape = mon->race->shapes;
	struct monster_race *race = NULL;

	/* Use the monster's preferred shapes if any */
	if (shape) {
		/* Pick one */
		int choice = randint0(mon->race->num_shapes);
		while (choice--) {
			shape = shape->next;
		}

		/* Race or base? */
		if (shape->race) {
			/* Simple */
			race = shape->race;
		} else {
			/* Set the shape base */
			shape_base = shape->base;

			/* Choose a race of the given base */
			get_mon_num_prep(monster_base_shape_okay);

			/* Pick a random race */
			race = get_mon_num(player->depth + 5, player->depth);

			/* Reset allocation table */
			get_mon_num_prep(NULL);
		}
	} else {
		/* Choose something the monster can summon */
		bitflag summon_spells[RSF_SIZE];
		int i, poss = 0, which, index, summon_type = 0;
		const struct monster_spell *spell;

		/* Extract the summon spells */
		create_mon_spell_mask(summon_spells, RST_SUMMON, RST_NONE);
		rsf_inter(summon_spells, mon->race->spell_flags);

		/* Count possibilities */
		for (i = rsf_next(summon_spells, FLAG_START); i != FLAG_END;
			 i = rsf_next(summon_spells, i + 1)) {
			poss++;
		}

		/* Pick one (defaults to ANY if no summons) */
		if (poss) {
			which = randint0(poss);
			index = rsf_next(summon_spells, FLAG_START);
			for (i = 0; i < which; i++) {
				index = rsf_next(summon_spells, index);
			}
			spell = monster_spell_by_index(index);

			/* Set the summon type, and the kin_base if necessary */
			summon_type = spell->effect->subtype;
			if (summon_type == summon_name_to_idx("KIN")) {
				kin_base = mon->race->base;
			}
		}

		/* Choose a race */
		race = select_shape(mon, summon_type);
	}

	/* Print a message immediately, update visuals */
	if (monster_is_obvious(mon)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msgt(MSG_GENERIC, "%s %s", m_name, "shimmers and changes!");
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
		square_light_spot(cave, mon->grid);
	}

	/* Set the race */
	if (race) {
		if (!mon->original_race) {
			mon->original_race = mon->race;
			assert(!mon->original_player_race);
			mon->original_player_race = mon->player_race;
		}
		mon->race = race;
		if (rf_has(race->flags, RF_PLAYER)) {
			mon->player_race = get_player_race();
		} else {
			mon->player_race = NULL;
		}
		mon->mspeed += mon->race->speed - mon->original_race->speed;
	}

	/* Emergency teleport if needed */
	if (!monster_passes_walls(mon) &&
		!square_is_monster_walkable(cave, mon->grid)) {
		effect_simple(EF_TELEPORT, source_monster(mon->midx), "1", 0, 0, 0,
					  mon->grid.y, mon->grid.x, NULL);
	}

	return mon->original_race != NULL;
}